

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

double despot::DESPOT::WEU(VNode *vnode,double xi)

{
  QNode *pQVar1;
  VNode *this;
  double dVar2;
  double dVar3;
  double dVar4;
  
  this = vnode;
  while( true ) {
    pQVar1 = VNode::parent(this);
    if (pQVar1 == (QNode *)0x0) break;
    pQVar1 = VNode::parent(this);
    this = QNode::parent(pQVar1);
  }
  dVar2 = Gap(vnode);
  dVar3 = VNode::Weight(vnode);
  dVar4 = Gap(this);
  return dVar2 - dVar3 * xi * dVar4;
}

Assistant:

double DESPOT::WEU(VNode* vnode, double xi) {
	VNode* root = vnode;
	while (root->parent() != NULL) {
		root = root->parent()->parent();
	}
	return Gap(vnode) - xi * vnode->Weight() * Gap(root);
}